

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O3

void bloaty::wasm::ReadNames
               (Section *section,IndexedNames *func_names,IndexedNames *dataseg_names,
               RangeSink *sink)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  char *pcVar7;
  mapped_type *this;
  char *pcVar8;
  char *pcVar9;
  char *filesize;
  string_view name;
  string_view section_1;
  string_view data;
  string_view local_b0;
  key_type local_9c;
  string_view local_98;
  RangeSink *local_88;
  _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_80;
  _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_78;
  char *local_70;
  char *local_68;
  _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_60;
  uint64_t local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_98._M_len = (section->contents)._M_len;
  local_98._M_str = (section->contents)._M_str;
  local_88 = sink;
  local_80 = (_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)func_names;
  local_78 = (_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)dataseg_names;
  if ((char *)local_98._M_len != (char *)0x0) {
    do {
      uVar5 = ReadLEB128Internal(false,7,&local_98);
      uVar6 = ReadLEB128Internal(false,0x20,&local_98);
      pcVar9 = (char *)(uVar6 & 0xffffffff);
      local_68 = (char *)local_98._M_len;
      pcVar7 = (char *)(local_98._M_len + -(long)pcVar9);
      if (local_98._M_len < pcVar9) {
LAB_001a143d:
        Throw("premature EOF reading variable-length DWARF data",0x47);
      }
      pcVar1 = local_98._M_str + (long)pcVar9;
      local_b0._M_str = local_98._M_str;
      local_b0._M_len = (size_t)pcVar9;
      local_98._M_len = (size_t)pcVar7;
      local_98._M_str = pcVar1;
      local_70 = pcVar9;
      if (((byte)((byte)uVar5 | 8) == 9) &&
         (uVar6 = ReadLEB128Internal(false,0x20,&local_b0), (int)uVar6 != 0)) {
        pcVar7 = (char *)local_b0._M_len;
        pcVar9 = local_b0._M_str;
        local_60 = local_78;
        if ((byte)uVar5 == 1) {
          local_60 = local_80;
        }
        do {
          local_58 = uVar6;
          uVar5 = ReadLEB128Internal(false,0x20,&local_b0);
          uVar6 = ReadLEB128Internal(false,0x20,&local_b0);
          pcVar1 = local_b0._M_str;
          name._M_len = (char *)(uVar6 & 0xffffffff);
          pcVar8 = (char *)(local_b0._M_len + -(long)name._M_len);
          if (local_b0._M_len < name._M_len) goto LAB_001a143d;
          pcVar2 = local_b0._M_str + (long)name._M_len;
          filesize = local_b0._M_str + ((long)name._M_len - (long)pcVar9);
          local_b0._M_len = (size_t)pcVar8;
          if (pcVar7 < filesize) {
            local_b0._M_str = pcVar2;
            Throw("region out-of-bounds",0x5d);
          }
          pcVar7 = (local_88->file_->data_)._M_str;
          pcVar3 = pcVar2;
          if ((pcVar7 <= pcVar9) && (pcVar9 < pcVar7 + (local_88->file_->data_)._M_len)) {
            name._M_str = local_b0._M_str;
            local_b0._M_str = pcVar2;
            RangeSink::AddFileRange
                      (local_88,"wasm_funcname",name,(long)pcVar9 - (long)pcVar7,(uint64_t)filesize)
            ;
            pcVar3 = local_b0._M_str;
          }
          local_b0._M_str = pcVar3;
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar1,pcVar2);
          local_9c = (key_type)uVar5;
          this = std::__detail::
                 _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_60,&local_9c);
          std::__cxx11::string::operator=((string *)this,(string *)local_50);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0],local_40[0] + 1);
          }
          uVar4 = (int)local_58 - 1;
          uVar6 = (uint64_t)uVar4;
          pcVar7 = pcVar8;
          pcVar9 = pcVar2;
        } while (uVar4 != 0);
      }
    } while (local_68 != local_70);
  }
  return;
}

Assistant:

void ReadNames(const Section& section, IndexedNames* func_names,
               IndexedNames* dataseg_names, RangeSink* sink) {
  enum class NameType {
    kModule = 0,
    kFunction = 1,
    kLocal = 2,
    kLabel = 3,
    kType = 4,
    kTable = 5,
    kMemory = 6,
    kGlobal = 7,
    kElemSegment = 8,
    kDataSegment = 9
  };

  string_view data = section.contents;

  while (!data.empty()) {
    NameType type = static_cast<NameType>(ReadVarUInt7(&data));
    uint32_t size = ReadVarUInt32(&data);
    string_view section = ReadPiece(size, &data);

    if (type == NameType::kFunction || type == NameType::kDataSegment) {
      uint32_t count = ReadVarUInt32(&section);
      for (uint32_t i = 0; i < count; i++) {
        string_view entry = section;
        uint32_t index = ReadVarUInt32(&section);
        uint32_t name_len = ReadVarUInt32(&section);
        string_view name = ReadPiece(name_len, &section);
        entry = StrictSubstr(entry, 0, name.data() - entry.data() + name.size());
        sink->AddFileRange("wasm_funcname", name, entry);
        IndexedNames *names = (type == NameType::kFunction ? func_names : dataseg_names);
        (*names)[index] = std::string(name);
      }
    }
  }
}